

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks(CFGStructurizer *this)

{
  CFGNode *node_00;
  undefined4 id;
  bool bVar1;
  reference ppCVar2;
  CFGNode *to;
  Builder *pBVar3;
  char *string;
  reference ppCVar4;
  undefined1 local_128 [8];
  IncomingValue incoming_1;
  size_t n;
  size_t i_1;
  IncomingValue incoming;
  size_t i;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_c8;
  undefined1 local_a8 [8];
  PHI phi;
  size_t natural_preds;
  CFGNode *dispatcher;
  CFGNode *merge_1;
  CFGNode **local_60;
  CFGStructurizer *local_58;
  undefined1 local_50 [8];
  CFGNode *merge;
  CFGNode *node;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *invalid_target;
  CFGNode *rewrite_header;
  CFGStructurizer *this_local;
  
  invalid_target = (CFGNode *)0x0;
  __range1 = (Vector<CFGNode_*> *)0x0;
  rewrite_header = (CFGNode *)this;
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&this->forward_post_visit_order);
  node = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&this->forward_post_visit_order);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&node);
    if (!bVar1) {
LAB_0018ebe2:
      if (__range1 == (Vector<CFGNode_*> *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        node_00 = invalid_target->loop_merge_block;
        to = create_helper_pred_block(this,node_00);
        invalid_target->loop_merge_block = to;
        phi.incoming.
        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::size(&to->pred);
        traverse_dominated_blocks_and_rewrite_branch(this,invalid_target,(CFGNode *)__range1,to);
        PHI::PHI((PHI *)local_a8);
        local_a8._0_4_ = SPIRVModule::allocate_id(this->module);
        pBVar3 = SPIRVModule::get_builder(this->module);
        local_a8._4_4_ = spv::Builder::makeBoolType(pBVar3);
        pBVar3 = SPIRVModule::get_builder(this->module);
        id = local_a8._0_4_;
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string(&local_e8,"break_selector_",(ThreadLocalAllocator<char> *)((long)&i + 7));
        std::operator+(&local_c8,&local_e8,&node_00->name);
        string = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                 c_str(&local_c8);
        spv::Builder::addName(pBVar3,id,string);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        ~basic_string(&local_c8);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        ~basic_string(&local_e8);
        incoming.id = 0;
        incoming._12_4_ = 0;
        for (; (ulong)incoming._8_8_ <
               phi.incoming.
               super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
            incoming._8_8_ = incoming._8_8_ + 1) {
          i_1 = 0;
          incoming.block._0_4_ = 0;
          ppCVar4 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::operator[](&to->pred,incoming._8_8_);
          i_1 = (size_t)*ppCVar4;
          pBVar3 = SPIRVModule::get_builder(this->module);
          incoming.block._0_4_ = spv::Builder::makeBoolConstant(pBVar3,true,false);
          std::
          vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       *)&phi.relaxed,(value_type *)&i_1);
        }
        n = (size_t)phi.incoming.
                    super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        incoming_1._8_8_ =
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::size(&to->pred);
        for (; n < (ulong)incoming_1._8_8_; n = n + 1) {
          local_128 = (undefined1  [8])0x0;
          incoming_1.block._0_4_ = 0;
          ppCVar4 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::operator[](&to->pred,n);
          local_128 = (undefined1  [8])*ppCVar4;
          pBVar3 = SPIRVModule::get_builder(this->module);
          incoming_1.block._0_4_ = spv::Builder::makeBoolConstant(pBVar3,false,false);
          std::
          vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       *)&phi.relaxed,(value_type *)local_128);
        }
        (to->ir).terminator.type = Condition;
        (to->ir).terminator.true_block = node_00;
        (to->ir).terminator.false_block = (CFGNode *)__range1;
        (to->ir).terminator.direct_block = (CFGNode *)0x0;
        (to->ir).terminator.conditional_id = local_a8._0_4_;
        std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::push_back
                  (&(to->ir).phi,(value_type *)local_a8);
        CFGNode::add_branch(to,(CFGNode *)__range1);
        recompute_cfg(this);
        this_local._7_1_ = 1;
        PHI::~PHI((PHI *)local_a8);
      }
      return (bool)(this_local._7_1_ & 1);
    }
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    merge = *ppCVar2;
    if ((((merge->merge == Loop) && ((merge->freeze_structured_analysis & 1U) != 0)) &&
        (local_50 = (undefined1  [8])merge->loop_merge_block, local_50 != (undefined1  [8])0x0)) &&
       (bVar1 = CFGNode::post_dominates((CFGNode *)local_50,merge), !bVar1)) {
      merge_1 = (CFGNode *)local_50;
      local_60 = (CFGNode **)&__range1;
      local_58 = this;
      CFGNode::
      traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
                (merge,(anon_class_24_3_8fce9826 *)&merge_1);
      if (__range1 != (Vector<CFGNode_*> *)0x0) {
        invalid_target = merge;
        goto LAB_0018ebe2;
      }
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool CFGStructurizer::rewrite_invalid_loop_breaks()
{
	// Keep iterating here until we have validated a clean CFG w.r.t. block-like loops.
	// This should pass through first time without issue with extremely high probability,
	// so hitting the slow path isn't a real concern until proven otherwise.
	CFGNode *rewrite_header = nullptr;
	CFGNode *invalid_target = nullptr;

	// Process from inside out.
	for (auto *node : forward_post_visit_order)
	{
		// Structured loop constructs can end up with problematic merge scenarios where we missed
		// some cases where blocks branch outside our construct.
		// At some point, we were considered mere selection constructs and breaking out of it is fine,
		// but if the selection is promoted to a loop at some point after this analysis, we are a bit screwed.
		// This can happen in complex ladder resolve scenarios.
		// The fix-up means introducing multiple levels of ladder blocks.
		if (node->merge == MergeType::Loop && node->freeze_structured_analysis)
		{
			auto *merge = node->loop_merge_block;
			if (!merge || merge->post_dominates(node))
				continue;

			node->traverse_dominated_blocks([&](CFGNode *candidate) {
				if (candidate == merge || invalid_target)
					return false;

				// If the succ can reach outside the loop construct, we have an error condition.
				for (auto *succ : candidate->succ)
				{
					if (!query_reachability(*succ, *merge))
					{
						// Determine if we're an inner terminate/return, or a loop exit.
						// If the common post-dominator is EXIT node, this is a return-like relationship,
						// and we skip any fixup.
						auto *pdom = CFGNode::find_common_post_dominator(succ, merge);
						if (pdom != nullptr && !pdom->pred.empty())
							invalid_target = succ;
					}
				}
				return true;
			});

			if (invalid_target)
			{
				rewrite_header = node;
				break;
			}
		}
	}

	if (invalid_target)
	{
		auto *merge = rewrite_header->loop_merge_block;
		auto *dispatcher = create_helper_pred_block(merge);
		rewrite_header->loop_merge_block = dispatcher;

		size_t natural_preds = dispatcher->pred.size();
		traverse_dominated_blocks_and_rewrite_branch(rewrite_header, invalid_target, dispatcher);

		PHI phi;
		phi.id = module.allocate_id();
		phi.type_id = module.get_builder().makeBoolType();
		module.get_builder().addName(phi.id, (String("break_selector_") + merge->name).c_str());

		for (size_t i = 0; i < natural_preds; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(true);
			phi.incoming.push_back(incoming);
		}

		for (size_t i = natural_preds, n = dispatcher->pred.size(); i < n; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(false);
			phi.incoming.push_back(incoming);
		}

		dispatcher->ir.terminator.type = Terminator::Type::Condition;
		dispatcher->ir.terminator.true_block = merge;
		dispatcher->ir.terminator.false_block = invalid_target;
		dispatcher->ir.terminator.direct_block = nullptr;
		dispatcher->ir.terminator.conditional_id = phi.id;

		dispatcher->ir.phi.push_back(std::move(phi));
		dispatcher->add_branch(invalid_target);

		recompute_cfg();
		return true;
	}

	return false;
}